

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

string * el::base::utils::Str::replaceAll(string *str,string *replaceWhat,string *replaceWith)

{
  __type_conflict _Var1;
  ulong uVar2;
  
  _Var1 = std::operator==(replaceWhat,replaceWith);
  if (!_Var1) {
    while (uVar2 = std::__cxx11::string::find((string *)str,(ulong)replaceWhat),
          uVar2 != 0xffffffffffffffff) {
      std::__cxx11::string::replace((ulong)str,uVar2,(string *)replaceWhat->_M_string_length);
    }
  }
  return str;
}

Assistant:

static inline std::string& replaceAll(std::string& str, const std::string& replaceWhat,
                                        const std::string& replaceWith) {
    if (replaceWhat == replaceWith)
      return str;
    std::size_t foundAt = std::string::npos;
    while ((foundAt = str.find(replaceWhat, foundAt + 1)) != std::string::npos) {
      str.replace(foundAt, replaceWhat.length(), replaceWith);
    }
    return str;
  }